

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_format(jit_State *J,RecordFFData *rd,TRef hdr,int sbufx)

{
  TRef TVar1;
  TRef TVar2;
  SFormat k;
  IRCallID IVar3;
  uint uVar4;
  GCobj *pGVar5;
  IRRef1 IVar6;
  IRCallID id;
  ulong uVar7;
  IRRef1 IVar8;
  FormatState fs;
  
  uVar7 = (ulong)(uint)sbufx;
  TVar1 = lj_ir_tostr(J,J->base[uVar7]);
  pGVar5 = (GCobj *)argv2str(J,rd->argv + uVar7);
  TVar2 = lj_ir_kgc(J,pGVar5,IRT_STR);
  (J->fold).ins.field_0.ot = 0x884;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  lj_opt_fold(J);
  fs.p = (uint8_t *)&(pGVar5->ud).len;
  fs.e = (uint8_t *)((long)pGVar5 + (ulong)(pGVar5->str).len + 0x18);
  TVar1 = hdr;
LAB_00152b6a:
  while( true ) {
    k = lj_strfmt_parse(&fs);
    IVar8 = (IRRef1)TVar1;
    if (k != 2) break;
    lj_ir_kint(J,2);
LAB_00152be2:
    pGVar5 = (GCobj *)lj_str_new(J->L,fs.str,(ulong)fs.len);
    TVar1 = lj_ir_kgc(J,pGVar5,IRT_STR);
    (J->fold).ins.field_0.ot = 0x5689;
    (J->fold).ins.field_0.op1 = IVar8;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
    TVar1 = lj_opt_fold(J);
  }
  if (k == 0) {
    if (sbufx != 0) {
      (J->fold).ins.field_0.op1 = IVar8;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x12000000;
      lj_opt_fold(J);
      return;
    }
    (J->fold).ins.field_0.ot = 0x5784;
    (J->fold).ins.field_0.op1 = IVar8;
    (J->fold).ins.field_0.op2 = (IRRef1)hdr;
    TVar1 = lj_opt_fold(J);
    *J->base = TVar1;
    return;
  }
  uVar4 = J->base[uVar7 + 1];
  TVar2 = lj_ir_kint(J,k);
  if (5 < (k & 0xf) - 2) {
LAB_00152e0f:
    recff_nyi(J,rd);
    return;
  }
  uVar7 = uVar7 + 1;
  IVar3 = IRCALL_lj_strfmt_putfnum_int;
  IVar6 = (IRRef1)uVar4;
  id = IRCALL_lj_strfmt_putfnum;
  switch(k & 0xf) {
  case 2:
    goto LAB_00152be2;
  case 4:
    IVar3 = IRCALL_lj_strfmt_putfnum_uint;
    break;
  case 5:
    goto switchD_00152bca_caseD_5;
  case 6:
    if ((uVar4 & 0x1f000000) == 0x4000000) {
      if (k != 6) {
        if ((k & 0x10) != 0) goto LAB_00152da1;
        IVar3 = IRCALL_lj_strfmt_putfstr;
        goto LAB_00152d98;
      }
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = IVar8;
      (J->fold).ins.field_0.op2 = IVar6;
      goto LAB_00152d2e;
    }
    goto LAB_00152e0f;
  case 7:
    uVar4 = lj_opt_narrow_toint(J,uVar4);
    if (k == 7) {
      (J->fold).ins.field_0.op1 = (IRRef1)uVar4;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5d040002;
      goto LAB_00152d0e;
    }
    id = IRCALL_lj_strfmt_putfchar;
    goto LAB_00152d5e;
  }
  if ((uVar4 >> 0x18 & 0x1f) - 0xf < 5) {
    if (k == 3) {
      (J->fold).ins.field_0.op1 = IVar6;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5d040000;
LAB_00152d0e:
      TVar1 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = IVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
LAB_00152d2e:
      TVar1 = lj_opt_fold(J);
      goto LAB_00152b6a;
    }
    (J->fold).ins.field_0.op1 = IVar6;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b160ad3;
    uVar4 = lj_opt_fold(J);
    id = IRCALL_lj_strfmt_putfxint;
  }
  else {
    id = IVar3;
    if ((uVar4 & 0x1f000000) == 0xa000000) {
      uVar4 = lj_crecord_loadiu64(J,uVar4,rd->argv + uVar7);
      IVar3 = IRCALL_lj_strfmt_putfxint;
LAB_00152d98:
      TVar1 = lj_ir_call(J,IVar3,(ulong)TVar1,(ulong)TVar2,(ulong)uVar4);
      goto LAB_00152b6a;
    }
switchD_00152bca_caseD_5:
    uVar4 = lj_ir_tonum(J,uVar4);
  }
LAB_00152d5e:
  TVar1 = lj_ir_call(J,id,(ulong)TVar1,(ulong)TVar2,(ulong)uVar4);
  goto LAB_00152b6a;
LAB_00152da1:
  TVar1 = lj_ir_call(J,IRCALL_lj_strfmt_putquoted,(ulong)TVar1,(ulong)uVar4);
  goto LAB_00152b6a;
}

Assistant:

static void recff_format(jit_State *J, RecordFFData *rd, TRef hdr, int sbufx)
{
  ptrdiff_t arg = sbufx;
  TRef tr = hdr, trfmt = lj_ir_tostr(J, J->base[arg]);
  GCstr *fmt = argv2str(J, &rd->argv[arg]);
  FormatState fs;
  SFormat sf;
  /* Specialize to the format string. */
  emitir(IRTG(IR_EQ, IRT_STR), trfmt, lj_ir_kstr(J, fmt));
  lj_strfmt_init(&fs, strdata(fmt), fmt->len);
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {  /* Parse format. */
    TRef tra = sf == STRFMT_LIT ? 0 : J->base[++arg];
    TRef trsf = lj_ir_kint(J, (int32_t)sf);
    IRCallID id;
    switch (STRFMT_TYPE(sf)) {
    case STRFMT_LIT:
      tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr,
		  lj_ir_kstr(J, lj_str_new(J->L, fs.str, fs.len)));
      break;
    case STRFMT_INT:
      id = IRCALL_lj_strfmt_putfnum_int;
    handle_int:
      if (!tref_isinteger(tra)) {
#if LJ_HASFFI
	if (tref_iscdata(tra)) {
	  tra = lj_crecord_loadiu64(J, tra, &rd->argv[arg]);
	  tr = lj_ir_call(J, IRCALL_lj_strfmt_putfxint, tr, trsf, tra);
	  break;
	}
#endif
	goto handle_num;
      }
      if (sf == STRFMT_INT) { /* Shortcut for plain %d. */
	tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr,
		    emitir(IRT(IR_TOSTR, IRT_STR), tra, IRTOSTR_INT));
      } else {
#if LJ_HASFFI
	tra = emitir(IRT(IR_CONV, IRT_U64), tra,
		     (IRT_INT|(IRT_U64<<5)|IRCONV_SEXT));
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfxint, tr, trsf, tra);
	lj_needsplit(J);
#else
	recff_nyiu(J, rd);  /* Don't bother working around this NYI. */
	return;
#endif
      }
      break;
    case STRFMT_UINT:
      id = IRCALL_lj_strfmt_putfnum_uint;
      goto handle_int;
    case STRFMT_NUM:
      id = IRCALL_lj_strfmt_putfnum;
    handle_num:
      tra = lj_ir_tonum(J, tra);
      tr = lj_ir_call(J, id, tr, trsf, tra);
      if (LJ_SOFTFP32) lj_needsplit(J);
      break;
    case STRFMT_STR:
      if (!tref_isstr(tra)) {
	recff_nyiu(J, rd);  /* NYI: __tostring and non-string types for %s. */
	/* NYI: also buffers. */
	return;
      }
      if (sf == STRFMT_STR)  /* Shortcut for plain %s. */
	tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr, tra);
      else if ((sf & STRFMT_T_QUOTED))
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putquoted, tr, tra);
      else
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfstr, tr, trsf, tra);
      break;
    case STRFMT_CHAR:
      tra = lj_opt_narrow_toint(J, tra);
      if (sf == STRFMT_CHAR)  /* Shortcut for plain %c. */
	tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr,
		    emitir(IRT(IR_TOSTR, IRT_STR), tra, IRTOSTR_CHAR));
      else
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfchar, tr, trsf, tra);
      break;
    case STRFMT_PTR:  /* NYI */
    case STRFMT_ERR:
    default:
      recff_nyiu(J, rd);
      return;
    }
  }
  if (sbufx) {
    emitir(IRT(IR_USE, IRT_NIL), tr, 0);
  } else {
    J->base[0] = emitir(IRTG(IR_BUFSTR, IRT_STR), tr, hdr);
  }
}